

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O0

QChar * decompositionHelper(char32_t ucs4,qsizetype *length,Decomposition *tag,QChar *buffer)

{
  uint uVar1;
  int iVar2;
  char16_t *pcVar3;
  QChar *in_RCX;
  uint *in_RDX;
  long *in_RSI;
  uint in_EDI;
  long in_FS_OFFSET;
  unsigned_short *decomposition;
  unsigned_short index;
  char32_t SIndex;
  uint local_50;
  uint local_4c;
  QChar *local_18;
  QChar local_e;
  QChar local_c;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_EDI < 0xac00) || (0xd7a3 < in_EDI)) {
    if (in_EDI < 0x3400) {
      local_4c = (uint)*(ushort *)
                        (QUnicodeTables::uc_decomposition_trie +
                        (ulong)((uint)*(ushort *)
                                       (QUnicodeTables::uc_decomposition_trie +
                                       (ulong)(in_EDI >> 4) * 2) + (in_EDI & 0xf)) * 2);
    }
    else {
      if (in_EDI < 0x30000) {
        local_50 = (uint)*(ushort *)
                          (QUnicodeTables::uc_decomposition_trie +
                          (ulong)((uint)*(ushort *)
                                         (QUnicodeTables::uc_decomposition_trie +
                                         (ulong)((in_EDI - 0x3400 >> 8) + 0x340) * 2) +
                                 (in_EDI & 0xff)) * 2);
      }
      else {
        local_50 = 0xffff;
      }
      local_4c = local_50;
    }
    if ((short)local_4c == -1) {
      *in_RSI = 0;
      *in_RDX = 0;
      local_18 = (QChar *)0x0;
    }
    else {
      *in_RDX = *(ushort *)(QUnicodeTables::uc_decomposition_map + (long)(int)local_4c * 2) & 0xff;
      *in_RSI = (long)((int)(uint)*(ushort *)
                                   (QUnicodeTables::uc_decomposition_map + (long)(int)local_4c * 2)
                      >> 8);
      local_18 = (QChar *)(QUnicodeTables::uc_decomposition_map + (long)(int)local_4c * 2 + 2);
    }
  }
  else {
    uVar1 = in_EDI - 0xac00;
    QChar::QChar<unsigned_int,_true>(&local_a,uVar1 / 0x24c + 0x1100);
    in_RCX->ucs = local_a.ucs;
    QChar::QChar<unsigned_int,_true>(&local_c,(int)(((ulong)uVar1 % 0x24c) / 0x1c) + 0x1161);
    in_RCX[1].ucs = local_c.ucs;
    QChar::QChar<unsigned_int,_true>(&local_e,uVar1 % 0x1c + 0x11a7);
    in_RCX[2].ucs = local_e.ucs;
    pcVar3 = QChar::unicode(in_RCX + 2);
    iVar2 = 3;
    if (*pcVar3 == L'ᆧ') {
      iVar2 = 2;
    }
    *in_RSI = (long)iVar2;
    *in_RDX = 1;
    local_18 = in_RCX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

static const QChar * QT_FASTCALL decompositionHelper(
    char32_t ucs4, qsizetype *length, QChar::Decomposition  *tag, QChar *buffer)
{
    if (ucs4 >= Hangul_SBase && ucs4 < Hangul_SBase + Hangul_SCount) {
        // compute Hangul syllable decomposition as per UAX #15
        const char32_t SIndex = ucs4 - Hangul_SBase;
        buffer[0] = QChar(Hangul_LBase + SIndex / Hangul_NCount); // L
        buffer[1] = QChar(Hangul_VBase + (SIndex % Hangul_NCount) / Hangul_TCount); // V
        buffer[2] = QChar(Hangul_TBase + SIndex % Hangul_TCount); // T
        *length = buffer[2].unicode() == Hangul_TBase ? 2 : 3;
        *tag = QChar::Canonical;
        return buffer;
    }

    const unsigned short index = GET_DECOMPOSITION_INDEX(ucs4);
    if (index == 0xffff) {
        *length = 0;
        *tag = QChar::NoDecomposition;
        return nullptr;
    }

    const unsigned short *decomposition = uc_decomposition_map+index;
    *tag = QChar::Decomposition((*decomposition) & 0xff);
    *length = (*decomposition) >> 8;
    return reinterpret_cast<const QChar *>(decomposition + 1);
}